

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.h
# Opt level: O0

DWARFDie __thiscall llvm::DWARFUnit::getDIEForOffset(DWARFUnit *this,uint64_t Offset)

{
  bool bVar1;
  bool bVar2;
  pointer this_00;
  DWARFDebugInfoEntry *pDVar3;
  reference D;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  local_40;
  DWARFDebugInfoEntry *local_38;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  local_30;
  iterator It;
  uint64_t Offset_local;
  DWARFUnit *this_local;
  
  It._M_current = (DWARFDebugInfoEntry *)Offset;
  extractDIEsIfNeeded(this,false);
  bVar1 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::empty
                    (&this->DieArray);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_38 = It._M_current;
    local_30._M_current =
         (DWARFDebugInfoEntry *)
         partition_point<std::vector<llvm::DWARFDebugInfoEntry,std::allocator<llvm::DWARFDebugInfoEntry>>&,llvm::DWARFUnit::getDIEForOffset(unsigned_long)::_lambda(llvm::DWARFDebugInfoEntry_const&)_1_,llvm::DWARFDebugInfoEntry&>
                   (&this->DieArray,It._M_current);
    local_40._M_current =
         (DWARFDebugInfoEntry *)
         std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::end
                   (&this->DieArray);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_40);
    bVar1 = false;
    if (bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
                ::operator->(&local_30);
      pDVar3 = (DWARFDebugInfoEntry *)DWARFDebugInfoEntry::getOffset(this_00);
      bVar1 = pDVar3 == It._M_current;
    }
    if (bVar1) {
      D = __gnu_cxx::
          __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
          ::operator*(&local_30);
      DWARFDie::DWARFDie((DWARFDie *)&this_local,this,D);
    }
    else {
      memset(&this_local,0,0x10);
      DWARFDie::DWARFDie((DWARFDie *)&this_local);
    }
    return _this_local;
  }
  __assert_fail("!DieArray.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                ,0x1dc,"DWARFDie llvm::DWARFUnit::getDIEForOffset(uint64_t)");
}

Assistant:

DWARFDie getDIEForOffset(uint64_t Offset) {
    extractDIEsIfNeeded(false);
    assert(!DieArray.empty());
    auto It =
        llvm::partition_point(DieArray, [=](const DWARFDebugInfoEntry &DIE) {
          return DIE.getOffset() < Offset;
        });
    if (It != DieArray.end() && It->getOffset() == Offset)
      return DWARFDie(this, &*It);
    return DWARFDie();
  }